

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O1

void printArithExtend(MCInst *MI,uint OpNum,SStream *O)

{
  uint16_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  MCOperand *pMVar6;
  ulong uVar7;
  char *s;
  uint uVar8;
  byte bVar9;
  uint val;
  byte bVar10;
  
  pMVar6 = MCInst_getOperand(MI,OpNum);
  uVar7 = MCOperand_getImm(pMVar6);
  switch((uint)(uVar7 >> 3) & 7) {
  case 0:
    uVar8 = 5;
    break;
  case 1:
    uVar8 = 6;
    break;
  case 2:
    uVar8 = 7;
    bVar9 = 1;
    goto LAB_0021cbb6;
  case 3:
    uVar8 = 8;
    bVar10 = 1;
    bVar9 = 0;
    goto LAB_0021cbb9;
  case 4:
    uVar8 = 9;
    break;
  case 5:
    uVar8 = 10;
    break;
  case 6:
    uVar8 = 0xb;
    break;
  case 7:
    uVar8 = 0xc;
  }
  bVar9 = 0;
LAB_0021cbb6:
  bVar10 = 0;
LAB_0021cbb9:
  val = (uint)uVar7 & 7;
  if (uVar8 - 7 < 2) {
    pMVar6 = MCInst_getOperand(MI,0);
    uVar3 = MCOperand_getReg(pMVar6);
    pMVar6 = MCInst_getOperand(MI,1);
    uVar4 = MCOperand_getReg(pMVar6);
    if (((bool)(bVar10 & (uVar4 == 4 || uVar3 == 4))) ||
       ((bool)(bVar9 & (uVar4 == 5 || uVar3 == 5)))) {
      if ((uVar7 & 7) == 0) {
        return;
      }
      s = ", lsl ";
      goto LAB_0021cc9f;
    }
  }
  SStream_concat(O,", %s",&DAT_003bf454 + *(int *)(&DAT_003bf440 + (ulong)uVar8 * 4));
  if (MI->csh->detail != CS_OPT_OFF) {
    iVar5 = 1;
    if (uVar8 - 6 < 7) {
      iVar5 = uVar8 - 4;
    }
    pcVar2 = MI->flat_insn->detail;
    *(int *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + -0xf) = iVar5;
  }
  if ((uVar7 & 7) == 0) {
    return;
  }
  s = " ";
LAB_0021cc9f:
  SStream_concat0(O,s);
  printInt32Bang(O,val);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->regs_write + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x1c + 9;
    puVar1[0] = 1;
    puVar1[1] = 0;
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + -0x13) = val;
  }
  return;
}

Assistant:

static void printArithExtend(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Val = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	AArch64_AM_ShiftExtendType ExtType = AArch64_AM_getArithExtendType(Val);
	unsigned ShiftVal = AArch64_AM_getArithShiftValue(Val);

	// If the destination or first source register operand is [W]SP, print
	// UXTW/UXTX as LSL, and if the shift amount is also zero, print nothing at
	// all.
	if (ExtType == AArch64_AM_UXTW || ExtType == AArch64_AM_UXTX) {
		unsigned Dest = MCOperand_getReg(MCInst_getOperand(MI, 0));
		unsigned Src1 = MCOperand_getReg(MCInst_getOperand(MI, 1));
		if ( ((Dest == AArch64_SP || Src1 == AArch64_SP) &&
					ExtType == AArch64_AM_UXTX) ||
				((Dest == AArch64_WSP || Src1 == AArch64_WSP) &&
				 ExtType == AArch64_AM_UXTW) ) {
			if (ShiftVal != 0) {
				SStream_concat0(O, ", lsl ");
				printInt32Bang(O, ShiftVal);
				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = ARM64_SFT_LSL;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = ShiftVal;
				}
			}

			return;
		}
	}

	SStream_concat(O, ", %s", AArch64_AM_getShiftExtendName(ExtType));
	if (MI->csh->detail) {
		arm64_extender ext = ARM64_EXT_INVALID;
		switch(ExtType) {
			default:	// never reach
			case AArch64_AM_UXTB:
				ext = ARM64_EXT_UXTB;
				break;
			case AArch64_AM_UXTH:
				ext = ARM64_EXT_UXTH;
				break;
			case AArch64_AM_UXTW:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_UXTX:
				ext = ARM64_EXT_UXTX;
				break;
			case AArch64_AM_SXTB:
				ext = ARM64_EXT_SXTB;
				break;
			case AArch64_AM_SXTH:
				ext = ARM64_EXT_SXTH;
				break;
			case AArch64_AM_SXTW:
				ext = ARM64_EXT_SXTW;
				break;
			case AArch64_AM_SXTX:
				ext = ARM64_EXT_SXTX;
				break;
		}

		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].ext = ext;
	}

	if (ShiftVal != 0) {
		SStream_concat0(O, " ");
		printInt32Bang(O, ShiftVal);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = ARM64_SFT_LSL;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = ShiftVal;
		}
	}
}